

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_1_3_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  float *data;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  float *pfVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  int scale;
  int iVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  float *pfVar47;
  int k_count;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [12];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [64];
  int data_width;
  int local_b4;
  
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar55._8_4_ = 0x80000000;
  auVar55._0_8_ = 0x8000000080000000;
  auVar55._12_4_ = 0x80000000;
  fVar62 = ipoint->scale;
  auVar82 = ZEXT464((uint)fVar62);
  auVar48 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)fVar62),auVar55,0xf8);
  auVar48 = ZEXT416((uint)(fVar62 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  fVar61 = -0.08 / (fVar62 * fVar62);
  scale = (int)auVar48._0_4_;
  auVar49._0_4_ = (int)auVar48._0_4_;
  auVar49._4_4_ = (int)auVar48._4_4_;
  auVar49._8_4_ = (int)auVar48._8_4_;
  auVar49._12_4_ = (int)auVar48._12_4_;
  auVar48 = vcvtdq2ps_avx(auVar49);
  auVar49 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)ipoint->x),auVar55,0xf8);
  auVar49 = ZEXT416((uint)(ipoint->x + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50._0_8_ = (double)auVar49._0_4_;
  auVar50._8_8_ = auVar49._8_8_;
  auVar54._0_8_ = (double)fVar62;
  auVar54._8_8_ = 0;
  auVar49 = vfmadd231sd_fma(auVar50,auVar54,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar49._0_8_;
  auVar53._4_12_ = auVar49._4_12_;
  auVar49 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)ipoint->y),auVar55,0xf8);
  fVar5 = auVar53._0_4_ - auVar48._0_4_;
  auVar49 = ZEXT416((uint)(ipoint->y + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar51._0_8_ = (double)auVar49._0_4_;
  auVar51._8_8_ = auVar49._8_8_;
  auVar49 = vfmadd231sd_fma(auVar51,auVar54,ZEXT816(0x3fe0000000000000));
  auVar52._0_4_ = (float)auVar49._0_8_;
  auVar52._4_12_ = auVar49._4_12_;
  fVar81 = auVar52._0_4_ - auVar48._0_4_;
  auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar62),auVar53);
  auVar49 = vpternlogd_avx512vl(auVar56,auVar48,auVar55,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = ZEXT416((uint)fVar62);
  if (scale < (int)auVar48._0_4_) {
    auVar57._8_4_ = 0x3effffff;
    auVar57._0_8_ = 0x3effffff3effffff;
    auVar57._12_4_ = 0x3effffff;
    auVar58._8_4_ = 0x80000000;
    auVar58._0_8_ = 0x8000000080000000;
    auVar58._12_4_ = 0x80000000;
    auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar49,auVar52);
    auVar50 = vpternlogd_avx512vl(auVar58,auVar48,auVar57,0xea);
    auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
    auVar48 = vroundss_avx(auVar48,auVar48,0xb);
    if (scale < (int)auVar48._0_4_) {
      auVar48 = vfmadd231ss_fma(auVar53,auVar49,ZEXT416(0x41300000));
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      auVar50 = vpternlogd_avx512vl(auVar59,auVar48,auVar57,0xea);
      auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
      auVar48 = vroundss_avx(auVar48,auVar48,0xb);
      if ((int)auVar48._0_4_ + scale <= iimage->width) {
        auVar48 = vfmadd231ss_fma(auVar52,auVar49,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar50 = vpternlogd_avx512vl(auVar57,auVar48,auVar15,0xf8);
        auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
        auVar48 = vroundss_avx(auVar48,auVar48,0xb);
        if ((int)auVar48._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar35 = iimage->data;
          iVar18 = scale * 2;
          lVar21 = 0;
          fVar5 = fVar5 + 0.5;
          iVar33 = -0xc;
          pfVar24 = haarResponseY + 2;
          pfVar47 = haarResponseX + 2;
          do {
            auVar48._0_4_ = (float)iVar33;
            auVar78 = in_ZMM9._4_12_;
            auVar48._4_12_ = auVar78;
            lVar30 = 0;
            auVar48 = vfmadd213ss_fma(auVar48,auVar49,ZEXT416((uint)(fVar81 + 0.5)));
            iVar17 = (int)auVar48._0_4_;
            iVar19 = (iVar17 + -1) * iVar2;
            iVar25 = (iVar17 + -1 + scale) * iVar2;
            iVar17 = (iVar17 + -1 + iVar18) * iVar2;
            do {
              iVar32 = (int)lVar30;
              auVar71._0_4_ = (float)(iVar32 + -0xc);
              auVar71._4_12_ = auVar78;
              auVar74._0_4_ = (float)(iVar32 + -0xb);
              auVar74._4_12_ = auVar78;
              auVar48 = vfmadd213ss_fma(auVar71,auVar49,ZEXT416((uint)fVar5));
              auVar50 = vfmadd213ss_fma(auVar74,auVar49,ZEXT416((uint)fVar5));
              iVar26 = (int)auVar48._0_4_;
              auVar72._0_4_ = (float)(iVar32 + -10);
              auVar72._4_12_ = auVar78;
              auVar48 = vfmadd213ss_fma(auVar72,auVar49,ZEXT416((uint)fVar5));
              iVar43 = iVar26 + -1 + scale;
              iVar39 = iVar26 + -1 + iVar18;
              fVar62 = pfVar35[iVar17 + -1 + iVar26];
              iVar41 = (int)auVar50._0_4_;
              fVar66 = pfVar35[iVar19 + iVar39];
              iVar38 = iVar41 + -1 + scale;
              iVar42 = iVar41 + -1 + iVar18;
              auVar52 = SUB6416(ZEXT464(0x40000000),0);
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar19 + iVar43] -
                                                      pfVar35[iVar43 + iVar17])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar39 + iVar17] -
                                                      pfVar35[iVar19 + -1 + iVar26])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar25 + -1 + iVar26] -
                                                      pfVar35[iVar25 + iVar39])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar39 + iVar17] -
                                                      pfVar35[iVar19 + -1 + iVar26])));
              pfVar47[lVar30 + -2] = (fVar62 - fVar66) + auVar50._0_4_;
              pfVar24[lVar30 + -2] = auVar51._0_4_ - (fVar62 - fVar66);
              fVar62 = pfVar35[iVar17 + -1 + iVar41];
              iVar43 = (int)auVar48._0_4_;
              fVar66 = pfVar35[iVar19 + iVar42];
              iVar39 = iVar43 + -1 + scale;
              iVar26 = iVar43 + -1 + iVar18;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar19 + iVar38] -
                                                      pfVar35[iVar38 + iVar17])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar42 + iVar17] -
                                                      pfVar35[iVar19 + -1 + iVar41])));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar25 + -1 + iVar41] -
                                                      pfVar35[iVar25 + iVar42])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar42 + iVar17] -
                                                      pfVar35[iVar19 + -1 + iVar41])));
              pfVar47[lVar30 + -1] = (fVar62 - fVar66) + auVar48._0_4_;
              pfVar24[lVar30 + -1] = auVar50._0_4_ - (fVar62 - fVar66);
              fVar62 = pfVar35[iVar17 + -1 + iVar43];
              fVar66 = pfVar35[iVar19 + iVar26];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar19 + iVar39] -
                                                      pfVar35[iVar39 + iVar17])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar26 + iVar17] -
                                                      pfVar35[iVar19 + -1 + iVar43])));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar25 + -1 + iVar43] -
                                                      pfVar35[iVar25 + iVar26])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar26 + iVar17] -
                                                      pfVar35[iVar19 + -1 + iVar43])));
              pfVar47[lVar30] = (fVar62 - fVar66) + auVar48._0_4_;
              pfVar24[lVar30] = auVar50._0_4_ - (fVar62 - fVar66);
              lVar30 = lVar30 + 3;
            } while (iVar32 + -0xc < 9);
            pfVar24 = pfVar24 + 0x18;
            pfVar47 = pfVar47 + 0x18;
            iVar33 = iVar33 + 1;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x18);
          goto LAB_00199408;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar30 = 0;
  lVar21 = 0;
  iVar18 = -0xc;
  do {
    auVar63._0_4_ = (float)iVar18;
    auVar63._4_12_ = in_ZMM8._4_12_;
    auVar48 = vfmadd213ss_fma(auVar63,auVar82._0_16_,ZEXT416((uint)fVar81));
    fVar62 = auVar48._0_4_;
    iVar42 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
    iVar19 = iVar2 + iVar42;
    iVar17 = iVar2 + -1 + iVar42;
    iVar25 = iVar42 + -1;
    iVar32 = iVar42 + -1 + scale;
    pfVar35 = haarResponseX;
    pfVar47 = haarResponseY;
    lVar29 = lVar30;
    iVar33 = -0xc;
    do {
      auVar64._0_4_ = (float)iVar33;
      auVar78 = in_ZMM8._4_12_;
      auVar64._4_12_ = auVar78;
      auVar76._0_4_ = (float)(iVar33 + 1);
      auVar76._4_12_ = auVar78;
      auVar51 = auVar82._0_16_;
      auVar48 = vfmadd213ss_fma(auVar64,auVar51,ZEXT416((uint)fVar5));
      auVar50 = vfmadd213ss_fma(auVar76,auVar51,ZEXT416((uint)fVar5));
      fVar75 = auVar50._0_4_;
      auVar68._0_4_ = (float)(iVar33 + 2);
      auVar68._4_12_ = auVar78;
      auVar50 = vfmadd213ss_fma(auVar68,auVar51,ZEXT416((uint)fVar5));
      fVar62 = auVar48._0_4_;
      fVar66 = auVar50._0_4_;
      iVar26 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
      if (((iVar42 < 1) || (iVar26 < 1)) || (iimage->height < iVar19)) {
LAB_0019903b:
        haarXY(iimage,iVar42,iVar26,scale,(float *)((long)pfVar35 + lVar29),
               (float *)((long)pfVar47 + lVar29));
        iVar43 = iimage->width;
        pfVar35 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar43 = iimage->width;
        iVar38 = iVar2 + iVar26;
        if (iVar43 < iVar38) goto LAB_0019903b;
        iVar41 = iVar26 + -1 + scale;
        iVar39 = iimage->data_width;
        pfVar24 = iimage->data;
        iVar46 = iVar39 * iVar25;
        iVar45 = iVar39 * iVar17;
        fVar62 = pfVar24[iVar45 + -1 + iVar26];
        fVar6 = pfVar24[iVar46 + -1 + iVar38];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar46 + iVar41] - pfVar24[iVar45 + iVar41]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar24[iVar45 + -1 + iVar38] -
                                                pfVar24[iVar46 + -1 + iVar26])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar39 * iVar32 + -1 + iVar26] -
                                                pfVar24[iVar39 * iVar32 + -1 + iVar38])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar24[iVar45 + -1 + iVar38] -
                                                pfVar24[iVar46 + -1 + iVar26])));
        *(float *)((long)pfVar35 + lVar29) = (fVar62 - fVar6) + auVar48._0_4_;
        *(float *)((long)pfVar47 + lVar29) = auVar50._0_4_ - (fVar62 - fVar6);
      }
      pfVar24 = (float *)((long)pfVar35 + lVar29 + 4);
      pfVar1 = (float *)((long)pfVar47 + lVar29 + 4);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75);
      if (((iVar42 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar38 = iVar2 + iVar26, iVar43 < iVar38)))) {
        haarXY(iimage,iVar42,iVar26,scale,pfVar24,pfVar1);
        iVar43 = iimage->width;
        pfVar35 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar39 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar41 = iVar26 + -1 + scale;
        iVar46 = iVar39 * iVar25;
        iVar45 = iVar39 * iVar17;
        fVar62 = pfVar3[iVar45 + -1 + iVar26];
        fVar75 = pfVar3[iVar46 + -1 + iVar38];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar41] - pfVar3[iVar45 + iVar41]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar38] -
                                                pfVar3[iVar46 + -1 + iVar26])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar39 * iVar32 + -1 + iVar26] -
                                                pfVar3[iVar39 * iVar32 + -1 + iVar38])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar38] -
                                                pfVar3[iVar46 + -1 + iVar26])));
        *pfVar24 = (fVar62 - fVar75) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar62 - fVar75);
      }
      pfVar24 = (float *)((long)pfVar35 + lVar29 + 8);
      pfVar1 = (float *)((long)pfVar47 + lVar29 + 8);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      if (((iVar42 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar38 = iVar2 + iVar26, iVar43 < iVar38)))) {
        haarXY(iimage,iVar42,iVar26,scale,pfVar24,pfVar1);
        pfVar35 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar43 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar39 = iVar26 + -1 + scale;
        iVar46 = iVar43 * iVar25;
        iVar41 = iVar43 * iVar17;
        fVar62 = pfVar3[iVar41 + -1 + iVar26];
        fVar66 = pfVar3[iVar46 + -1 + iVar38];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar39] - pfVar3[iVar41 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar41 + -1 + iVar38] -
                                                pfVar3[iVar46 + -1 + iVar26])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 * iVar32 + -1 + iVar26] -
                                                pfVar3[iVar43 * iVar32 + -1 + iVar38])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar41 + -1 + iVar38] -
                                                pfVar3[iVar46 + -1 + iVar26])));
        *pfVar24 = (fVar62 - fVar66) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar62 - fVar66);
      }
      auVar82 = ZEXT1664(auVar49);
      lVar29 = lVar29 + 0xc;
      bVar4 = iVar33 < 9;
      iVar33 = iVar33 + 3;
    } while (bVar4);
    iVar18 = iVar18 + 1;
    lVar21 = lVar21 + 1;
    lVar30 = lVar30 + 0x60;
  } while (lVar21 != 0x18);
LAB_00199408:
  fVar81 = auVar82._0_4_;
  auVar80._8_4_ = 0x3effffff;
  auVar80._0_8_ = 0x3effffff3effffff;
  auVar80._12_4_ = 0x3effffff;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar48 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 0.5)),auVar79,0xf8);
  auVar48 = ZEXT416((uint)(fVar81 * 0.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 1.5)),auVar79,0xf8);
  auVar49 = ZEXT416((uint)(fVar81 * 1.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 2.5)),auVar79,0xf8);
  auVar50 = ZEXT416((uint)(fVar81 * 2.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 3.5)),auVar79,0xf8);
  auVar51 = ZEXT416((uint)(fVar81 * 3.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 4.5)),auVar79,0xf8);
  auVar52 = ZEXT416((uint)(fVar81 * 4.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 5.5)),auVar79,0xf8);
  auVar53 = ZEXT416((uint)(fVar81 * 5.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 6.5)),auVar79,0xf8);
  auVar54 = ZEXT416((uint)(fVar81 * 6.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 7.5)),auVar79,0xf8);
  auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar81 * 7.5));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 8.5)),auVar79,0xf8);
  auVar56 = ZEXT416((uint)(fVar81 * 8.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 9.5)),auVar79,0xf8);
  auVar57 = ZEXT416((uint)(fVar81 * 9.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 10.5)),auVar79,0xf8);
  auVar58 = ZEXT416((uint)(fVar81 * 10.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 11.5)),auVar79,0xf8);
  fVar67 = auVar50._0_4_;
  fVar62 = fVar67 + auVar49._0_4_;
  fVar5 = fVar67 + auVar48._0_4_;
  auVar50 = ZEXT416((uint)(fVar81 * 11.5 + auVar59._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  fVar81 = fVar67 - auVar48._0_4_;
  fVar66 = fVar67 - auVar49._0_4_;
  fVar75 = fVar67 - auVar51._0_4_;
  fVar6 = fVar67 - auVar52._0_4_;
  fVar7 = fVar67 - auVar53._0_4_;
  fVar67 = fVar67 - auVar54._0_4_;
  fVar77 = auVar55._0_4_;
  fVar8 = fVar77 - auVar51._0_4_;
  fVar9 = fVar77 - auVar52._0_4_;
  fVar10 = fVar77 - auVar53._0_4_;
  fVar11 = fVar77 - auVar54._0_4_;
  fVar12 = fVar77 - auVar56._0_4_;
  fVar13 = fVar77 - auVar57._0_4_;
  fVar14 = fVar77 - auVar58._0_4_;
  fVar77 = fVar77 - auVar50._0_4_;
  gauss_s1_c0[0] = expf(fVar62 * fVar62 * fVar61);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar61);
  gauss_s1_c0[2] = expf(fVar81 * fVar81 * fVar61);
  gauss_s1_c0[3] = expf(fVar66 * fVar66 * fVar61);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar75 * fVar75 * fVar61);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar61);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar61);
  gauss_s1_c0[8] = expf(fVar67 * fVar67 * fVar61);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar61);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar61);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar61);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar61);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar61);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar61);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar61);
  gauss_s1_c1[8] = expf(fVar77 * fVar77 * fVar61);
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  uVar22 = 0xfffffff8;
  fVar62 = 0.0;
  lVar21 = 0;
  lVar30 = 0;
  local_b4 = 0;
  do {
    pfVar35 = gauss_s1_c1;
    uVar20 = (uint)uVar22;
    if (uVar20 != 7) {
      pfVar35 = gauss_s1_c0;
    }
    lVar29 = (long)local_b4;
    lVar30 = (long)(int)lVar30;
    if (uVar20 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    uVar40 = 0;
    local_b4 = local_b4 + 4;
    uVar34 = 0xfffffff8;
    lVar36 = (long)haarResponseX + lVar21;
    lVar28 = (long)haarResponseY + lVar21;
    do {
      pfVar47 = gauss_s1_c1;
      if (uVar34 != 7) {
        pfVar47 = gauss_s1_c0;
      }
      auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar34 == 0xfffffff8) {
        pfVar47 = gauss_s1_c1;
      }
      uVar23 = (ulong)(uVar34 >> 0x1c & 0xfffffff8);
      uVar27 = uVar40;
      lVar31 = lVar28;
      lVar44 = lVar36;
      do {
        lVar37 = 0;
        pfVar24 = (float *)((long)pfVar35 + (ulong)(uint)((int)(uVar22 >> 0x1f) << 5));
        do {
          fVar5 = pfVar47[uVar23] * *pfVar24;
          pfVar24 = pfVar24 + (ulong)(~uVar20 >> 0x1f) * 2 + -1;
          auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar31 + lVar37 * 4)),
                                  ZEXT416(*(uint *)(lVar44 + lVar37 * 4)),0x10);
          lVar37 = lVar37 + 1;
          auVar73._0_4_ = fVar5 * auVar48._0_4_;
          auVar73._4_4_ = fVar5 * auVar48._4_4_;
          auVar73._8_4_ = fVar5 * auVar48._8_4_;
          auVar73._12_4_ = fVar5 * auVar48._12_4_;
          auVar48 = vandps_avx(auVar73,auVar65);
          auVar48 = vmovlhps_avx(auVar73,auVar48);
          auVar69._0_4_ = auVar82._0_4_ + auVar48._0_4_;
          auVar69._4_4_ = auVar82._4_4_ + auVar48._4_4_;
          auVar69._8_4_ = auVar82._8_4_ + auVar48._8_4_;
          auVar69._12_4_ = auVar82._12_4_ + auVar48._12_4_;
          auVar82 = ZEXT1664(auVar69);
        } while (lVar37 != 9);
        uVar27 = uVar27 + 0x18;
        uVar23 = uVar23 + (ulong)(-1 < (int)uVar34) * 2 + -1;
        lVar44 = lVar44 + 0x60;
        lVar31 = lVar31 + 0x60;
      } while (uVar27 < uVar34 * 0x18 + 0x198);
      uVar34 = uVar34 + 5;
      uVar40 = uVar40 + 0x78;
      fVar5 = gauss_s2_arr[lVar29];
      auVar16._4_4_ = fVar5;
      auVar16._0_4_ = fVar5;
      auVar16._8_4_ = fVar5;
      auVar16._12_4_ = fVar5;
      auVar51 = vmulps_avx512vl(auVar69,auVar16);
      lVar29 = lVar29 + 1;
      auVar70._0_4_ = auVar51._0_4_ * auVar51._0_4_;
      auVar70._4_4_ = auVar51._4_4_ * auVar51._4_4_;
      auVar70._8_4_ = auVar51._8_4_ * auVar51._8_4_;
      auVar70._12_4_ = auVar51._12_4_ * auVar51._12_4_;
      auVar49 = vshufpd_avx(auVar51,auVar51,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar30) = auVar51;
      lVar30 = lVar30 + 4;
      lVar36 = lVar36 + 0x1e0;
      lVar28 = lVar28 + 0x1e0;
      auVar48 = vmovshdup_avx(auVar70);
      auVar50 = vfmadd231ss_fma(auVar48,auVar51,auVar51);
      auVar48 = vshufps_avx(auVar51,auVar51,0xff);
      auVar49 = vfmadd213ss_fma(auVar49,auVar49,auVar50);
      auVar48 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      fVar62 = fVar62 + auVar48._0_4_;
    } while (local_b4 != (int)lVar29);
    lVar21 = lVar21 + 0x14;
    uVar22 = (ulong)(uVar20 + 5);
  } while ((int)uVar20 < 3);
  if (fVar62 < 0.0) {
    fVar62 = sqrtf(fVar62);
  }
  else {
    auVar48 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
    fVar62 = auVar48._0_4_;
  }
  lVar21 = 0;
  auVar82 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar62)));
  do {
    auVar60 = vmulps_avx512f(auVar82,*(undefined1 (*) [64])(ipoint->descriptor + lVar21));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar21) = auVar60;
    lVar21 = lVar21 + 0x10;
  } while (lVar21 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}